

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

char * sx_os_path_basename(char *dst,int size,char *path)

{
  char *pcVar1;
  
  pcVar1 = sx_strrchar(path,'/');
  if ((pcVar1 == (char *)0x0) && (pcVar1 = sx_strrchar(path,'\\'), pcVar1 == (char *)0x0)) {
    if (dst == path) {
      return dst;
    }
  }
  else {
    path = pcVar1 + 1;
  }
  sx_strcpy(dst,size,path);
  return dst;
}

Assistant:

char* sx_os_path_basename(char* dst, int size, const char* path)
{
    const char* r = sx_strrchar(path, '/');
    if (!r)
        r = sx_strrchar(path, '\\');
    if (r) {
        sx_strcpy(dst, size, r + 1);
    } else if (dst != path) {
        sx_strcpy(dst, size, path);
    }
    return dst;
}